

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frameutils.cpp
# Opt level: O2

frame * frame_from_string(frame *__return_storage_ptr__,string *s)

{
  string local_40 [32];
  
  frame::frame(__return_storage_ptr__);
  std::__cxx11::string::substr((ulong)local_40,(ulong)s);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->crc,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::substr((ulong)local_40,(ulong)s);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::substr((ulong)local_40,(ulong)s);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->func,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::substr((ulong)local_40,(ulong)s);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->data,local_40);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

frame frame_from_string(string s) {
	frame result;
	long len = s.size();
	result.crc = s.substr(len - 16, 16);
	result.addr = s.substr(0, 8);
	result.func = s.substr(8, 8);
	result.data = s.substr(16, len - 32);
	return result;
}